

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_manager.cpp
# Opt level: O0

shared_ptr<cab> __thiscall
cab_manager::find_cab(cab_manager *this,node_type src,node_type dst,uint32_t passengers)

{
  int iVar1;
  bool bVar2;
  uint32_t uVar3;
  int32_t iVar4;
  reference pvVar5;
  mapped_type *__x;
  reference pwVar6;
  element_type *peVar7;
  reference pnVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000031;
  long lVar9;
  int in_R8D;
  shared_ptr<cab> sVar10;
  iterator local_1b0;
  iterator local_190;
  iterator local_170;
  undefined1 local_150 [8];
  _Deque_iterator<node_type,_node_type_&,_node_type_*> it;
  iterator iStack_128;
  node_type n;
  iterator __end2;
  iterator __begin2;
  vector<node_type,_std::allocator<node_type>_> *__range2;
  vector<node_type,_std::allocator<node_type>_> vec;
  int32_t cost;
  shared_ptr<cab> shared;
  weak_ptr<cab> cab;
  iterator __end3;
  iterator __begin3;
  vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_> *__range3;
  vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_> cabs;
  _Self local_98;
  byte local_8d;
  uint local_8c;
  value_type local_85;
  int32_t min;
  node_type current;
  undefined1 local_78 [8];
  deque<node_type,_std::allocator<node_type>_> queue;
  bool cycle;
  uint32_t passengers_local;
  node_type dst_local;
  node_type src_local;
  cab_manager *this_local;
  shared_ptr<cab> *chosen;
  
  lVar9 = CONCAT71(in_register_00000031,src);
  queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node._7_1_ = 0;
  cycle = (bool)dst;
  _passengers_local = lVar9;
  this_local = this;
  std::deque<node_type,_std::allocator<node_type>_>::deque
            ((deque<node_type,_std::allocator<node_type>_> *)local_78);
  std::deque<node_type,_std::allocator<node_type>_>::push_back
            ((deque<node_type,_std::allocator<node_type>_> *)local_78,&cycle);
  do {
    bVar2 = std::deque<node_type,_std::allocator<node_type>_>::empty
                      ((deque<node_type,_std::allocator<node_type>_> *)local_78);
    if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_001d900b;
    pvVar5 = std::deque<node_type,_std::allocator<node_type>_>::front
                       ((deque<node_type,_std::allocator<node_type>_> *)local_78);
    local_85 = *pvVar5;
    std::deque<node_type,_std::allocator<node_type>_>::pop_front
              ((deque<node_type,_std::allocator<node_type>_> *)local_78);
    local_8c = 0x7fffffff;
    local_8d = 0;
    std::shared_ptr<cab>::shared_ptr((shared_ptr<cab> *)this,(nullptr_t)0x0);
    local_98._M_node =
         (_Base_ptr)
         std::
         map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
         ::find((map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
                 *)(lVar9 + 0x40),&local_85);
    cabs.super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
                  ::end((map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
                         *)(lVar9 + 0x40));
    bVar2 = std::operator!=(&local_98,
                            (_Self *)&cabs.
                                      super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar2) {
      __x = std::
            map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
            ::operator[]((map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
                          *)(lVar9 + 0x40),&local_85);
      std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::vector
                ((vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_> *)&__range3,__x);
      __end3 = std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::begin
                         ((vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_> *)
                          &__range3);
      cab.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::end
                     ((vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_> *)&__range3)
      ;
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
                                         *)&cab.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>.
                                            _M_refcount), bVar2) {
        pwVar6 = __gnu_cxx::
                 __normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
                 ::operator*(&__end3);
        std::weak_ptr<cab>::weak_ptr
                  ((weak_ptr<cab> *)
                   &shared.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pwVar6);
        std::weak_ptr<cab>::lock((weak_ptr<cab> *)&cost);
        peVar7 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                           ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            &cost);
        uVar3 = ::cab::passengers_at_node(peVar7,cycle);
        if (uVar3 + in_R8D < 5) {
          peVar7 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                              &cost);
          iVar4 = ::cab::calculate_costs(peVar7,cycle,(node_type)passengers);
          vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = iVar4;
          peVar7 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                              &cost);
          uVar3 = ::cab::costs(peVar7);
          iVar1 = (int32_t)vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
          if (iVar4 - uVar3 < local_8c) {
            peVar7 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&cost);
            uVar3 = ::cab::costs(peVar7);
            local_8c = iVar1 - uVar3;
            std::shared_ptr<cab>::operator=((shared_ptr<cab> *)this,(shared_ptr<cab> *)&cost);
          }
          vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        }
        else {
          vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 5;
        }
        std::shared_ptr<cab>::~shared_ptr((shared_ptr<cab> *)&cost);
        if (vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
          vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        }
        std::weak_ptr<cab>::~weak_ptr
                  ((weak_ptr<cab> *)
                   &shared.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        __gnu_cxx::
        __normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
        ::operator++(&__end3);
      }
      std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::~vector
                ((vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_> *)&__range3);
    }
    if (local_8c == 0x7fffffff) {
      road_network::get_predecessors
                ((vector<node_type,_std::allocator<node_type>_> *)&__range2,
                 (road_network *)(lVar9 + 0x70),local_85);
      __end2 = std::vector<node_type,_std::allocator<node_type>_>::begin
                         ((vector<node_type,_std::allocator<node_type>_> *)&__range2);
      iStack_128 = std::vector<node_type,_std::allocator<node_type>_>::end
                             ((vector<node_type,_std::allocator<node_type>_> *)&__range2);
      while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffed8), bVar2) {
        pnVar8 = __gnu_cxx::
                 __normal_iterator<node_type_*,_std::vector<node_type,_std::allocator<node_type>_>_>
                 ::operator*(&__end2);
        it._M_node._7_1_ = *pnVar8;
        std::deque<node_type,_std::allocator<node_type>_>::begin
                  (&local_170,(deque<node_type,_std::allocator<node_type>_> *)local_78);
        std::deque<node_type,_std::allocator<node_type>_>::end
                  (&local_190,(deque<node_type,_std::allocator<node_type>_> *)local_78);
        std::find<std::_Deque_iterator<node_type,node_type&,node_type*>,node_type>
                  ((_Deque_iterator<node_type,_node_type_&,_node_type_*> *)local_150,&local_170,
                   &local_190,(node_type *)((long)&it._M_node + 7));
        std::deque<node_type,_std::allocator<node_type>_>::end
                  (&local_1b0,(deque<node_type,_std::allocator<node_type>_> *)local_78);
        bVar2 = std::operator==((_Self *)local_150,&local_1b0);
        if (bVar2) {
          std::deque<node_type,_std::allocator<node_type>_>::push_back
                    ((deque<node_type,_std::allocator<node_type>_> *)local_78,
                     (value_type *)((long)&it._M_node + 7));
        }
        __gnu_cxx::
        __normal_iterator<node_type_*,_std::vector<node_type,_std::allocator<node_type>_>_>::
        operator++(&__end2);
      }
      pvVar5 = std::deque<node_type,_std::allocator<node_type>_>::front
                         ((deque<node_type,_std::allocator<node_type>_> *)local_78);
      if (((bool)*pvVar5 == cycle) &&
         ((queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
           super__Deque_impl_data._M_finish._M_node._7_1_ & 1) != 0)) {
        vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
      }
      else {
        pvVar5 = std::deque<node_type,_std::allocator<node_type>_>::front
                           ((deque<node_type,_std::allocator<node_type>_> *)local_78);
        if (((bool)*pvVar5 == cycle) &&
           ((queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node._7_1_ & 1) == 0)) {
          queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
          super__Deque_impl_data._M_finish._M_node._7_1_ = 1;
        }
        vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      std::vector<node_type,_std::allocator<node_type>_>::~vector
                ((vector<node_type,_std::allocator<node_type>_> *)&__range2);
    }
    else {
      local_8d = 1;
      vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
    }
    if ((local_8d & 1) == 0) {
      std::shared_ptr<cab>::~shared_ptr((shared_ptr<cab> *)this);
    }
  } while (vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ == 0);
  if (vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ == 3) {
LAB_001d900b:
    std::shared_ptr<cab>::shared_ptr((shared_ptr<cab> *)this,(nullptr_t)0x0);
    vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
  }
  std::deque<node_type,_std::allocator<node_type>_>::~deque
            ((deque<node_type,_std::allocator<node_type>_> *)local_78);
  sVar10.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar10.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<cab>)sVar10.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<cab> cab_manager::find_cab(node_type src, node_type dst, std::uint32_t passengers)
{
    bool cycle = false;
    std::deque<node_type> queue;
    queue.push_back(src);

    while(!queue.empty())
    {
        node_type current = queue.front();
        queue.pop_front();

        std::int32_t min = INT32_MAX;
        std::shared_ptr<cab> chosen = nullptr;
        if(_cabs_at_node.find(current) != _cabs_at_node.end())
        {
            std::vector<std::weak_ptr<cab>> cabs = _cabs_at_node[current];
            for(auto cab : cabs)
            {
                auto shared = cab.lock();
                if(shared->passengers_at_node(src) + passengers > 4)
                {
                    continue;
                }

                // calculate cost
                std::int32_t cost = shared->calculate_costs(src, dst);
                if((cost - shared->costs()) < min)
                {
                    min = cost - shared->costs();
                    chosen = shared;
                }
            }
        }

        if(min != INT32_MAX)
        {
            return chosen;
        }

        std::vector<node_type> vec = _rnet.get_predecessors(current);
        for(auto n : vec)
        {
            auto it = std::find(queue.begin(), queue.end(), n);
            if(it == queue.end())
            {
                queue.push_back(n);
            }
        }

        // break after two cycles due to edge case src = P4
        if(queue.front() == src && cycle)
        {
            break;
        }
        else if (queue.front() == src && !cycle)
        {
            cycle = true;
        }
        
    }
    return nullptr;
}